

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iunk.c
# Opt level: O2

int envy_bios_parse_iunk21(envy_bios *bios)

{
  uint8_t *res;
  uint8_t *res_00;
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  envy_bios_iunk21_entry *peVar8;
  ulong uVar9;
  ulong uVar10;
  char *__format;
  
  uVar3 = (bios->iunk21).offset;
  if (uVar3 == 0) {
    return 0;
  }
  iVar4 = bios_u8(bios,(uint)uVar3,&(bios->iunk21).version);
  res = &(bios->iunk21).hlen;
  iVar5 = bios_u8(bios,(bios->iunk21).offset + 1,res);
  res_00 = &(bios->iunk21).rlen;
  iVar6 = bios_u8(bios,(bios->iunk21).offset + 2,res_00);
  iVar7 = bios_u8(bios,(bios->iunk21).offset + 3,&(bios->iunk21).entriesnum);
  if (iVar7 == 0 && (iVar6 == 0 && (iVar5 == 0 && iVar4 == 0))) {
    envy_bios_block(bios,(uint)(bios->iunk21).offset,
                    (uint)(bios->iunk21).entriesnum * (uint)(bios->iunk21).rlen +
                    (uint)(bios->iunk21).hlen,"IUNK21",-1);
    bVar1 = (bios->iunk21).version;
    if (bVar1 == 0x10) {
      bVar1 = *res;
      uVar9 = (ulong)bVar1;
      if (bVar1 < 4) {
        __format = "IUNK21 table header too short [%d < %d]\n";
        uVar10 = 4;
      }
      else {
        bVar2 = *res_00;
        if (2 < bVar2) {
          if (bVar1 != 4) {
            fprintf(_stderr,"IUNK21 table header longer than expected [%d > %d]\n");
            bVar2 = *res_00;
          }
          if (3 < bVar2) {
            fprintf(_stderr,"IUNK21 table record longer than expected [%d > %d]\n",(ulong)bVar2);
          }
          uVar10 = (ulong)(bios->iunk21).entriesnum;
          peVar8 = (envy_bios_iunk21_entry *)calloc(uVar10,8);
          (bios->iunk21).entries = peVar8;
          if (peVar8 == (envy_bios_iunk21_entry *)0x0) {
            return -0xc;
          }
          for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
            peVar8[uVar9].offset =
                 (ushort)(bios->iunk21).rlen * (short)uVar9 +
                 (ushort)(bios->iunk21).hlen + (bios->iunk21).offset;
          }
          (bios->iunk21).valid = '\x01';
          return 0;
        }
        __format = "IUNK21 table record too short [%d < %d]\n";
        uVar10 = 3;
        uVar9 = (ulong)(uint)bVar2;
      }
    }
    else {
      uVar9 = (ulong)(bVar1 >> 4);
      uVar10 = (ulong)(bVar1 & 0xf);
      __format = "Unknown IUNK21 table version %d.%d\n";
    }
    fprintf(_stderr,__format,uVar9,uVar10);
    iVar4 = -0x16;
  }
  else {
    iVar4 = -0xe;
  }
  return iVar4;
}

Assistant:

int envy_bios_parse_iunk21 (struct envy_bios *bios) {
	struct envy_bios_iunk21 *iunk21 = &bios->iunk21;
	if (!iunk21->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, iunk21->offset, &iunk21->version);
	err |= bios_u8(bios, iunk21->offset+1, &iunk21->hlen);
	err |= bios_u8(bios, iunk21->offset+2, &iunk21->rlen);
	err |= bios_u8(bios, iunk21->offset+3, &iunk21->entriesnum);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, iunk21->offset, iunk21->hlen + iunk21->rlen * iunk21->entriesnum, "IUNK21", -1);
	int wanthlen = 0;
	int wantrlen = 0;
	switch (iunk21->version) {
		case 0x10:
			wanthlen = 4;
			wantrlen = 3;
			break;
		default:
			ENVY_BIOS_ERR("Unknown IUNK21 table version %d.%d\n", iunk21->version >> 4, iunk21->version & 0xf);
			return -EINVAL;
	}
	if (iunk21->hlen < wanthlen) {
		ENVY_BIOS_ERR("IUNK21 table header too short [%d < %d]\n", iunk21->hlen, wanthlen);
		return -EINVAL;
	}
	if (iunk21->rlen < wantrlen) {
		ENVY_BIOS_ERR("IUNK21 table record too short [%d < %d]\n", iunk21->rlen, wantrlen);
		return -EINVAL;
	}
	if (iunk21->hlen > wanthlen) {
		ENVY_BIOS_WARN("IUNK21 table header longer than expected [%d > %d]\n", iunk21->hlen, wanthlen);
	}
	if (iunk21->rlen > wantrlen) {
		ENVY_BIOS_WARN("IUNK21 table record longer than expected [%d > %d]\n", iunk21->rlen, wantrlen);
	}
	iunk21->entries = calloc(iunk21->entriesnum, sizeof *iunk21->entries);
	if (!iunk21->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < iunk21->entriesnum; i++) {
		struct envy_bios_iunk21_entry *entry = &iunk21->entries[i];
		entry->offset = iunk21->offset + iunk21->hlen + iunk21->rlen * i;
		/* XXX */
		if (err)
			return -EFAULT;
	}
	iunk21->valid = 1;
	return 0;
}